

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void tplt_xfer(char *name,FILE *in,FILE *out,int *lineno)

{
  int iVar1;
  char *pcVar2;
  ushort **ppuVar3;
  bool local_41a;
  byte local_418 [8];
  char line [1000];
  int iStart;
  int i;
  int *lineno_local;
  FILE *out_local;
  FILE *in_local;
  char *name_local;
  
  while( true ) {
    pcVar2 = fgets((char *)local_418,1000,(FILE *)in);
    local_41a = false;
    if (pcVar2 != (char *)0x0) {
      local_41a = local_418[0] != 0x25 || local_418[1] != '%';
    }
    if (!local_41a) break;
    *lineno = *lineno + 1;
    line[0x3e0] = '\0';
    line[0x3e1] = '\0';
    line[0x3e2] = '\0';
    line[0x3e3] = '\0';
    if (name != (char *)0x0) {
      line[0x3e4] = '\0';
      line[0x3e5] = '\0';
      line[0x3e6] = '\0';
      line[999] = '\0';
      for (; local_418[(int)line._996_4_] != 0; line._996_4_ = line._996_4_ + 1) {
        if (((local_418[(int)line._996_4_] == 0x50) &&
            (iVar1 = strncmp((char *)(local_418 + (int)line._996_4_),"Parse",5), iVar1 == 0)) &&
           ((line._996_4_ == 0 ||
            (ppuVar3 = __ctype_b_loc(),
            ((*ppuVar3)[(int)(uint)local_418[line._996_4_ + -1]] & 0x400) == 0)))) {
          if ((int)line._992_4_ < (int)line._996_4_) {
            fprintf((FILE *)out,"%.*s",(ulong)(uint)(line._996_4_ - line._992_4_),
                    local_418 + (int)line._992_4_);
          }
          fprintf((FILE *)out,"%s",name);
          line._992_4_ = line._996_4_ + 5;
          line._996_4_ = line._996_4_ + 4;
        }
      }
    }
    fprintf((FILE *)out,"%s",local_418 + (int)line._992_4_);
  }
  return;
}

Assistant:

PRIVATE void tplt_xfer(char *name, FILE *in, FILE *out, int *lineno)
{
  int i, iStart;
  char line[LINESIZE];
  while( fgets(line,LINESIZE,in) && (line[0]!='%' || line[1]!='%') ){
    (*lineno)++;
    iStart = 0;
    if( name ){
      for(i=0; line[i]; i++){
        if( line[i]=='P' && strncmp(&line[i],"Parse",5)==0
          && (i==0 || !ISALPHA(line[i-1]))
        ){
          if( i>iStart ) fprintf(out,"%.*s",i-iStart,&line[iStart]);
          fprintf(out,"%s",name);
          i += 4;
          iStart = i+1;
        }
      }
    }
    fprintf(out,"%s",&line[iStart]);
  }
}